

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KCPServer.cpp
# Opt level: O0

void __thiscall net_uv::KCPServer::executeOperation(KCPServer *this)

{
  KCPSession *pKVar1;
  bool bVar2;
  int32_t iVar3;
  reference __x;
  pointer ppVar4;
  reference ppVar5;
  pair<const_unsigned_int,_net_uv::KCPServer::serverSessionData> *it_4;
  iterator __end4;
  iterator __begin4;
  map<unsigned_int,_net_uv::KCPServer::serverSessionData,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_net_uv::KCPServer::serverSessionData>_>_>
  *__range4;
  _Self local_58;
  _Self local_50;
  iterator it_3;
  _Self local_40;
  iterator it_2;
  _Self local_30;
  iterator it_1;
  _Self local_20;
  iterator it;
  value_type *curOperation;
  KCPServer *this_local;
  
  iVar3 = Mutex::trylock(&(this->super_Server).super_SessionManager.m_operationMutex);
  if (iVar3 == 0) {
    bVar2 = std::
            queue<net_uv::SessionManager::SessionOperation,_std::deque<net_uv::SessionManager::SessionOperation,_std::allocator<net_uv::SessionManager::SessionOperation>_>_>
            ::empty(&(this->super_Server).super_SessionManager.m_operationQue);
    if (bVar2) {
      Mutex::unlock(&(this->super_Server).super_SessionManager.m_operationMutex);
    }
    else {
      while (bVar2 = std::
                     queue<net_uv::SessionManager::SessionOperation,_std::deque<net_uv::SessionManager::SessionOperation,_std::allocator<net_uv::SessionManager::SessionOperation>_>_>
                     ::empty(&(this->super_Server).super_SessionManager.m_operationQue),
            ((bVar2 ^ 0xffU) & 1) != 0) {
        __x = std::
              queue<net_uv::SessionManager::SessionOperation,_std::deque<net_uv::SessionManager::SessionOperation,_std::allocator<net_uv::SessionManager::SessionOperation>_>_>
              ::front(&(this->super_Server).super_SessionManager.m_operationQue);
        std::
        queue<net_uv::SessionManager::SessionOperation,_std::deque<net_uv::SessionManager::SessionOperation,_std::allocator<net_uv::SessionManager::SessionOperation>_>_>
        ::push(&(this->super_Server).super_SessionManager.m_operationDispatchQue,__x);
        std::
        queue<net_uv::SessionManager::SessionOperation,_std::deque<net_uv::SessionManager::SessionOperation,_std::allocator<net_uv::SessionManager::SessionOperation>_>_>
        ::pop(&(this->super_Server).super_SessionManager.m_operationQue);
      }
      Mutex::unlock(&(this->super_Server).super_SessionManager.m_operationMutex);
      while (bVar2 = std::
                     queue<net_uv::SessionManager::SessionOperation,_std::deque<net_uv::SessionManager::SessionOperation,_std::allocator<net_uv::SessionManager::SessionOperation>_>_>
                     ::empty(&(this->super_Server).super_SessionManager.m_operationDispatchQue),
            ((bVar2 ^ 0xffU) & 1) != 0) {
        it._M_node = (_Base_ptr)
                     std::
                     queue<net_uv::SessionManager::SessionOperation,_std::deque<net_uv::SessionManager::SessionOperation,_std::allocator<net_uv::SessionManager::SessionOperation>_>_>
                     ::front(&(this->super_Server).super_SessionManager.m_operationDispatchQue);
        switch((it._M_node)->_M_color) {
        case _S_red:
          __end4 = std::
                   map<unsigned_int,_net_uv::KCPServer::serverSessionData,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_net_uv::KCPServer::serverSessionData>_>_>
                   ::begin(&this->m_allSession);
          it_4 = (pair<const_unsigned_int,_net_uv::KCPServer::serverSessionData> *)
                 std::
                 map<unsigned_int,_net_uv::KCPServer::serverSessionData,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_net_uv::KCPServer::serverSessionData>_>_>
                 ::end(&this->m_allSession);
          while (bVar2 = std::operator!=(&__end4,(_Self *)&it_4), bVar2) {
            ppVar5 = std::
                     _Rb_tree_iterator<std::pair<const_unsigned_int,_net_uv::KCPServer::serverSessionData>_>
                     ::operator*(&__end4);
            if (((ppVar5->second).isInvalid & 1U) == 0) {
              (*(((ppVar5->second).session)->super_Session)._vptr_Session[9])();
            }
            std::
            _Rb_tree_iterator<std::pair<const_unsigned_int,_net_uv::KCPServer::serverSessionData>_>
            ::operator++(&__end4);
          }
          (*(this->m_server->super_Socket)._vptr_Socket[7])();
          (this->super_Server).m_serverStage = WAIT_CLOSE_SERVER_SOCKET;
          Runnable::stopTimerUpdate((Runnable *)this);
          break;
        case _S_black:
          local_20._M_node =
               (_Base_ptr)
               std::
               map<unsigned_int,_net_uv::KCPServer::serverSessionData,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_net_uv::KCPServer::serverSessionData>_>_>
               ::find(&this->m_allSession,(uint32_t *)((long)&(it._M_node)->_M_left + 4));
          it_1 = std::
                 map<unsigned_int,_net_uv::KCPServer::serverSessionData,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_net_uv::KCPServer::serverSessionData>_>_>
                 ::end(&this->m_allSession);
          bVar2 = std::operator!=(&local_20,&it_1);
          if (bVar2) {
            ppVar4 = std::
                     _Rb_tree_iterator<std::pair<const_unsigned_int,_net_uv::KCPServer::serverSessionData>_>
                     ::operator->(&local_20);
            pKVar1 = (ppVar4->second).session;
            (*(pKVar1->super_Session)._vptr_Session[7])
                      (pKVar1,(it._M_node)->_M_parent,(ulong)*(uint *)&(it._M_node)->_M_left);
          }
          else {
            free((it._M_node)->_M_parent);
          }
          break;
        case 2:
          local_30._M_node =
               (_Base_ptr)
               std::
               map<unsigned_int,_net_uv::KCPServer::serverSessionData,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_net_uv::KCPServer::serverSessionData>_>_>
               ::find(&this->m_allSession,(uint32_t *)((long)&(it._M_node)->_M_left + 4));
          it_2 = std::
                 map<unsigned_int,_net_uv::KCPServer::serverSessionData,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_net_uv::KCPServer::serverSessionData>_>_>
                 ::end(&this->m_allSession);
          bVar2 = std::operator!=(&local_30,&it_2);
          if (bVar2) {
            ppVar4 = std::
                     _Rb_tree_iterator<std::pair<const_unsigned_int,_net_uv::KCPServer::serverSessionData>_>
                     ::operator->(&local_30);
            pKVar1 = (ppVar4->second).session;
            (*(pKVar1->super_Session)._vptr_Session[8])
                      (pKVar1,(it._M_node)->_M_parent,(ulong)*(uint *)&(it._M_node)->_M_left);
          }
          else {
            free((it._M_node)->_M_parent);
          }
          break;
        case 3:
          local_40._M_node =
               (_Base_ptr)
               std::
               map<unsigned_int,_net_uv::KCPServer::serverSessionData,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_net_uv::KCPServer::serverSessionData>_>_>
               ::find(&this->m_allSession,(uint32_t *)((long)&(it._M_node)->_M_left + 4));
          it_3 = std::
                 map<unsigned_int,_net_uv::KCPServer::serverSessionData,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_net_uv::KCPServer::serverSessionData>_>_>
                 ::end(&this->m_allSession);
          bVar2 = std::operator!=(&local_40,&it_3);
          if (bVar2) {
            ppVar4 = std::
                     _Rb_tree_iterator<std::pair<const_unsigned_int,_net_uv::KCPServer::serverSessionData>_>
                     ::operator->(&local_40);
            (*(((ppVar4->second).session)->super_Session)._vptr_Session[9])();
          }
          break;
        case 4:
          local_50._M_node =
               (_Base_ptr)
               std::
               map<unsigned_int,_net_uv::KCPServer::serverSessionData,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_net_uv::KCPServer::serverSessionData>_>_>
               ::find(&this->m_allSession,(uint32_t *)((long)&(it._M_node)->_M_left + 4));
          local_58._M_node =
               (_Base_ptr)
               std::
               map<unsigned_int,_net_uv::KCPServer::serverSessionData,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_net_uv::KCPServer::serverSessionData>_>_>
               ::end(&this->m_allSession);
          bVar2 = std::operator!=(&local_50,&local_58);
          if (bVar2) {
            ppVar4 = std::
                     _Rb_tree_iterator<std::pair<const_unsigned_int,_net_uv::KCPServer::serverSessionData>_>
                     ::operator->(&local_50);
            (**(((ppVar4->second).session)->super_Session)._vptr_Session)();
            ppVar4 = std::
                     _Rb_tree_iterator<std::pair<const_unsigned_int,_net_uv::KCPServer::serverSessionData>_>
                     ::operator->(&local_50);
            free((ppVar4->second).session);
            local_50._M_node =
                 (_Base_ptr)
                 std::
                 map<unsigned_int,net_uv::KCPServer::serverSessionData,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,net_uv::KCPServer::serverSessionData>>>
                 ::erase_abi_cxx11_((map<unsigned_int,net_uv::KCPServer::serverSessionData,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,net_uv::KCPServer::serverSessionData>>>
                                     *)&this->m_allSession,local_50._M_node);
          }
        }
        std::
        queue<net_uv::SessionManager::SessionOperation,_std::deque<net_uv::SessionManager::SessionOperation,_std::allocator<net_uv::SessionManager::SessionOperation>_>_>
        ::pop(&(this->super_Server).super_SessionManager.m_operationDispatchQue);
      }
    }
  }
  return;
}

Assistant:

void KCPServer::executeOperation()
{
	if (m_operationMutex.trylock() != 0)
	{
		return;
	}

	if (m_operationQue.empty())
	{
		m_operationMutex.unlock();
		return;
	}

	while (!m_operationQue.empty())
	{
		m_operationDispatchQue.push(m_operationQue.front());
		m_operationQue.pop();
	}
	m_operationMutex.unlock();

	while (!m_operationDispatchQue.empty())
	{
		auto & curOperation = m_operationDispatchQue.front();
		switch (curOperation.operationType)
		{
		case KCP_SVR_OP_SEND_DATA:
		{
			auto it = m_allSession.find(curOperation.sessionID);
			if (it != m_allSession.end())
			{
				it->second.session->executeSend((char*)curOperation.operationData, curOperation.operationDataLen);
			}
			else
			{
				//invalid session
				fc_free(curOperation.operationData);
			}
		}break;
		case KCP_SVR_OP_SEND_CLOSE:
		{
			auto it = m_allSession.find(curOperation.sessionID);
			if (it != m_allSession.end())
			{
				it->second.session->executeSendAndClose((char*)curOperation.operationData, curOperation.operationDataLen);
			}
			else
			{
				//invalid session
				fc_free(curOperation.operationData);
			}
		}break;
		case KCP_SVR_OP_DIS_SESSION:
		{
			auto it = m_allSession.find(curOperation.sessionID);
			if (it != m_allSession.end())
			{
				it->second.session->executeDisconnect();
			}
		}break;
		case KCP_SVR_OP_SEND_DIS_SESSION_MSG_TO_MAIN_THREAD:
		{
			auto it = m_allSession.find(curOperation.sessionID);
			if (it != m_allSession.end())
			{
				it->second.session->~KCPSession();
				fc_free(it->second.session);
				it = m_allSession.erase(it);
			}
		}break;
		case KCP_SVR_OP_STOP_SERVER:
		{
			for (auto & it : m_allSession)
			{
				if (!it.second.isInvalid)
				{
					it.second.session->executeDisconnect();
				}
			}
			m_server->disconnect();
			m_serverStage = ServerStage::WAIT_CLOSE_SERVER_SOCKET;

			stopTimerUpdate();
		}break;
		default:
			break;
		}
		m_operationDispatchQue.pop();
	}
}